

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegIterReverseNewPage(Fts5Index *p,Fts5SegIter *pIter)

{
  bool bVar1;
  byte bVar2;
  u16 uVar3;
  Fts5Data *pData;
  u8 *a;
  int iRowidOff;
  Fts5Data *pNew;
  Fts5SegIter *pIter_local;
  Fts5Index *p_local;
  
  fts5DataRelease(pIter->pLeaf);
  pIter->pLeaf = (Fts5Data *)0x0;
  while( true ) {
    do {
      bVar1 = false;
      if (p->rc == 0) {
        bVar1 = pIter->iTermLeafPgno < pIter->iLeafPgno;
      }
      if (!bVar1) goto LAB_001d8bdf;
      pIter->iLeafPgno = pIter->iLeafPgno + -1;
      pData = fts5DataRead(p,((long)pIter->pSeg->iSegid << 0x25) + (long)pIter->iLeafPgno);
    } while (pData == (Fts5Data *)0x0);
    if (pIter->iLeafPgno == pIter->iTermLeafPgno) {
      if (pIter->iTermLeafOffset < pData->szLeaf) {
        pIter->pLeaf = pData;
        pIter->iLeafOffset = pIter->iTermLeafOffset;
      }
    }
    else {
      uVar3 = fts5GetU16(pData->p);
      if (uVar3 != 0) {
        pIter->pLeaf = pData;
        pIter->iLeafOffset = (uint)uVar3;
      }
    }
    if (pIter->pLeaf != (Fts5Data *)0x0) break;
    fts5DataRelease(pData);
  }
  bVar2 = sqlite3Fts5GetVarint(pIter->pLeaf->p + pIter->iLeafOffset,(u64 *)&pIter->iRowid);
  pIter->iLeafOffset = (uint)bVar2 + pIter->iLeafOffset;
LAB_001d8bdf:
  if (pIter->pLeaf != (Fts5Data *)0x0) {
    pIter->iEndofDoclist = pIter->pLeaf->nn + 1;
    fts5SegIterReverseInitPage(p,pIter);
  }
  return;
}

Assistant:

static void fts5SegIterReverseNewPage(Fts5Index *p, Fts5SegIter *pIter){
  assert( pIter->flags & FTS5_SEGITER_REVERSE );
  assert( pIter->flags & FTS5_SEGITER_ONETERM );

  fts5DataRelease(pIter->pLeaf);
  pIter->pLeaf = 0;
  while( p->rc==SQLITE_OK && pIter->iLeafPgno>pIter->iTermLeafPgno ){
    Fts5Data *pNew;
    pIter->iLeafPgno--;
    pNew = fts5DataRead(p, FTS5_SEGMENT_ROWID(
          pIter->pSeg->iSegid, pIter->iLeafPgno
    ));
    if( pNew ){
      /* iTermLeafOffset may be equal to szLeaf if the term is the last
      ** thing on the page - i.e. the first rowid is on the following page.
      ** In this case leave pIter->pLeaf==0, this iterator is at EOF. */
      if( pIter->iLeafPgno==pIter->iTermLeafPgno ){
        assert( pIter->pLeaf==0 );
        if( pIter->iTermLeafOffset<pNew->szLeaf ){
          pIter->pLeaf = pNew;
          pIter->iLeafOffset = pIter->iTermLeafOffset;
        }
      }else{
        int iRowidOff;
        iRowidOff = fts5LeafFirstRowidOff(pNew);
        if( iRowidOff ){
          pIter->pLeaf = pNew;
          pIter->iLeafOffset = iRowidOff;
        }
      }

      if( pIter->pLeaf ){
        u8 *a = &pIter->pLeaf->p[pIter->iLeafOffset];
        pIter->iLeafOffset += fts5GetVarint(a, (u64*)&pIter->iRowid);
        break;
      }else{
        fts5DataRelease(pNew);
      }
    }
  }

  if( pIter->pLeaf ){
    pIter->iEndofDoclist = pIter->pLeaf->nn+1;
    fts5SegIterReverseInitPage(p, pIter);
  }
}